

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThrowErrorObject.cpp
# Opt level: O0

ThrowErrorObject *
Js::ThrowErrorObject::New(StaticType *type,JavascriptError *error,Recycler *recycler)

{
  Recycler *alloc;
  ThrowErrorObject *this;
  TrackAllocData local_48;
  Recycler *local_20;
  Recycler *recycler_local;
  JavascriptError *error_local;
  StaticType *type_local;
  
  local_20 = recycler;
  recycler_local = (Recycler *)error;
  error_local = (JavascriptError *)type;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ThrowErrorObject.cpp"
             ,0x34);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_48);
  this = (ThrowErrorObject *)new<Memory::Recycler>(0x18,alloc,0x43c4b0);
  ThrowErrorObject(this,(StaticType *)error_local,(JavascriptError *)recycler_local);
  return this;
}

Assistant:

ThrowErrorObject* ThrowErrorObject::New(StaticType* type, JavascriptError* error, Recycler* recycler)
    {
        return RecyclerNew(recycler, ThrowErrorObject, type, error);
    }